

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-magic.c
# Opt level: O1

void borg_prepare_book_info(void)

{
  wchar_t wVar1;
  char *__s2;
  player *p;
  borg_magic *pbVar2;
  borg_spell_rating *pbVar3;
  _Bool _Var4;
  uint uVar5;
  int iVar6;
  class_spell *pcVar7;
  char *pcVar8;
  wchar_t *pwVar9;
  wchar_t wVar10;
  wchar_t wVar11;
  long lVar12;
  
  uVar5 = player->class->cidx - 1;
  if (uVar5 < 8) {
    borg_spell_ratings = (borg_spell_rating *)(&PTR_borg_spell_ratings_MAGE_002d2750)[uVar5];
    if (borg_magics != (borg_magic *)0x0) {
      mem_free(borg_magics);
    }
    borg_magics = (borg_magic *)mem_zalloc((long)(player->class->magic).total_spells << 5);
    if (L'\0' < (player->class->magic).total_spells) {
      lVar12 = 0;
      do {
        pbVar2 = borg_magics;
        pcVar7 = spell_by_index(player,(wchar_t)lVar12);
        pbVar3 = borg_spell_ratings;
        pcVar8 = pcVar7->name;
        __s2 = borg_spell_ratings[lVar12].name;
        iVar6 = strcmp(pcVar8,__s2);
        if (iVar6 == 0) {
          pbVar2[lVar12].rating = pbVar3[lVar12].rating;
          pbVar2[lVar12].name = __s2;
          pbVar2[lVar12].spell_enum = pbVar3[lVar12].spell_enum;
          pbVar2[lVar12].level = (uint8_t)pcVar7->slevel;
          p = player;
          wVar1 = pcVar7->sidx;
          iVar6 = -1;
          if ((L'\xffffffff' < wVar1) && (wVar1 < (player->class->magic).total_spells)) {
            pwVar9 = &((player->class->magic).books)->num_spells;
            wVar11 = L'\0';
            do {
              wVar10 = wVar11;
              wVar11 = *pwVar9 + wVar10;
              pwVar9 = pwVar9 + 8;
            } while (wVar11 <= wVar1);
            iVar6 = wVar1 - wVar10;
          }
          pbVar2[lVar12].book_offset = iVar6;
          pbVar2[lVar12].effect_index = pcVar7->effect->index;
          pbVar2[lVar12].power = (uint8_t)pcVar7->smana;
          pbVar2[lVar12].sfail = (uint8_t)pcVar7->sfail;
          _Var4 = spell_okay_to_cast(p,(wchar_t)lVar12);
          pbVar2[lVar12].status = _Var4;
          pbVar2[lVar12].times = 0;
          pbVar2[lVar12].book = pcVar7->bidx;
        }
        else {
          pcVar8 = format("**STARTUP FAILURE** spell definition mismatch. <%s> not the same as <%s>"
                          ,pcVar8,__s2);
          borg_note(pcVar8);
          borg_init_failure = true;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < (player->class->magic).total_spells);
    }
  }
  else {
    borg_spell_ratings = (borg_spell_rating *)0x0;
  }
  return;
}

Assistant:

void borg_prepare_book_info(void)
{
    switch (player->class->cidx) {
    case CLASS_MAGE:
        borg_spell_ratings = borg_spell_ratings_MAGE;
        break;
    case CLASS_DRUID:
        borg_spell_ratings = borg_spell_ratings_DRUID;
        break;
    case CLASS_PRIEST:
        borg_spell_ratings = borg_spell_ratings_PRIEST;
        break;
    case CLASS_NECROMANCER:
        borg_spell_ratings = borg_spell_ratings_NECROMANCER;
        break;
    case CLASS_PALADIN:
        borg_spell_ratings = borg_spell_ratings_PALADIN;
        break;
    case CLASS_ROGUE:
        borg_spell_ratings = borg_spell_ratings_ROGUE;
        break;
    case CLASS_RANGER:
        borg_spell_ratings = borg_spell_ratings_RANGER;
        break;
    case CLASS_BLACKGUARD:
        borg_spell_ratings = borg_spell_ratings_BLACKGUARD;
        break;
    default:
        borg_spell_ratings = NULL;
        return;
    }

    if (borg_magics)
        mem_free(borg_magics);

    borg_magics
        = mem_zalloc(player->class->magic.total_spells * sizeof(borg_magic));

    for (int spell = 0; spell < player->class->magic.total_spells; spell++) {
        borg_init_spell(borg_magics, spell);
    }
}